

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_float.cpp
# Opt level: O0

float ximu::FixedFloat::toFloat(char msb,char lsb,Qvals q)

{
  short fixedValue;
  float fVar1;
  Qvals q_local;
  char lsb_local;
  char msb_local;
  
  fixedValue = toFixed(msb,lsb);
  fVar1 = toFloat(fixedValue,q);
  return fVar1;
}

Assistant:

float FixedFloat::toFloat(char msb, char lsb, Qvals q) {
  return toFloat(toFixed(msb, lsb), q);
}